

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

word Abc_SopToTruth(char *pSop,int nInputs)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  
  lVar3 = 0;
  do {
    if (pSop[lVar3] == '\0') {
      uVar2 = 0xffffffff;
LAB_001ef0e0:
      if (6 < uVar2) {
        __assert_fail("nVars >= 0 && nVars <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x49a,"word Abc_SopToTruth(char *, int)");
      }
      if (uVar2 != nInputs) {
        __assert_fail("nVars == nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x49b,"word Abc_SopToTruth(char *, int)");
      }
      iVar5 = 0;
      uVar4 = 0;
      do {
        if (uVar2 == 0) {
          uVar6 = 0xffffffffffffffff;
          iVar7 = iVar5;
        }
        else {
          pcVar8 = pSop + iVar5;
          iVar7 = iVar5 + uVar2;
          uVar6 = 0xffffffffffffffff;
          lVar3 = 0;
          do {
            cVar1 = *pcVar8;
            if (cVar1 != '-') {
              if (cVar1 == '0') {
                uVar6 = uVar6 & ~*(ulong *)((long)Abc_SopToTruth::Truth + lVar3);
              }
              else {
                if (cVar1 != '1') {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                                ,0x4a5,"word Abc_SopToTruth(char *, int)");
                }
                uVar6 = uVar6 & *(ulong *)((long)Abc_SopToTruth::Truth + lVar3);
              }
            }
            lVar3 = lVar3 + 8;
            pcVar8 = pcVar8 + 1;
          } while ((ulong)uVar2 << 3 != lVar3);
        }
        if (pSop[iVar7] != ' ') {
          __assert_fail("pSop[lit] == \' \'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                        ,0x4a8,"word Abc_SopToTruth(char *, int)");
        }
        if (pSop[(long)iVar7 + 2] != '\n') {
          __assert_fail("pSop[lit] == \'\\n\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                        ,0x4ab,"word Abc_SopToTruth(char *, int)");
        }
        uVar4 = uVar4 | uVar6;
        iVar5 = iVar5 + uVar2 + 3;
      } while (pSop[iVar5] != '\0');
      iVar5 = Abc_SopIsComplement(pSop);
      return uVar4 ^ (long)-iVar5;
    }
    if (pSop[lVar3] == '\n') {
      uVar2 = (int)lVar3 - 2;
      goto LAB_001ef0e0;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

word Abc_SopToTruth( char * pSop, int nInputs )
{
    static word Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    word Cube, Result = 0;
    int v, lit = 0;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( nVars >= 0 && nVars <= 6 );
    assert( nVars == nInputs );
    do {
        Cube = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                Cube &=  Truth[v];
            else if ( pSop[lit] == '0' )
                Cube &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        Result |= Cube;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
        Result = ~Result;
    return Result;
}